

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04_signalfd_epoll.c
# Opt level: O2

void handle_signals(void)

{
  ssize_t sVar1;
  char *__s;
  signalfd_siginfo sfd_si;
  
  sVar1 = read(sfd,&sfd_si,0x80);
  if (sVar1 == -1) {
    perror("read()");
    exit(1);
  }
  if (sfd_si.ssi_signo == 0xe) {
    __s = "Got SIGALRM via SignalFD.";
  }
  else {
    if (sfd_si.ssi_signo == 3) {
      puts("Got SIGQUIT. Will exit.");
      exit(0);
    }
    __s = "Got unexpected signal!";
  }
  puts(__s);
  return;
}

Assistant:

void handle_signals() {
    struct signalfd_siginfo sfd_si;
    if (read(sfd, &sfd_si, sizeof(sfd_si)) == -1)
        handle_error("read()");

    if (sfd_si.ssi_signo == SIGALRM)
        printf("Got SIGALRM via SignalFD.\n");
    else if (sfd_si.ssi_signo == SIGQUIT) {
        printf("Got SIGQUIT. Will exit.\n");
        exit(0);
    }
    else
        printf("Got unexpected signal!\n");
}